

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

bool __thiscall
perfetto::protos::gen::GpuCounterDescriptor_GpuCounterSpec::ParseFromArray
          (GpuCounterDescriptor_GpuCounterSpec *this,void *raw,size_t size)

{
  byte bVar1;
  pointer pGVar2;
  pointer pGVar3;
  iterator iVar4;
  iterator __position;
  bool bVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong *puVar10;
  GpuCounterDescriptor_GpuCounterGroup *pGVar11;
  ulong uVar12;
  uint8_t cur_byte_3;
  uint8_t cur_byte_2;
  ulong *puVar13;
  uint8_t cur_byte;
  ulong uVar14;
  uint8_t cur_byte_1;
  ulong *puVar15;
  Field local_70;
  string *local_60;
  string *local_58;
  vector<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup>_>
  *local_50;
  vector<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
  *local_48;
  vector<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
  *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  
  pGVar2 = (this->numerator_units_).
           super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->numerator_units_).
      super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
      ._M_impl.super__Vector_impl_data._M_finish != pGVar2) {
    (this->numerator_units_).
    super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
    ._M_impl.super__Vector_impl_data._M_finish = pGVar2;
  }
  pGVar2 = (this->denominator_units_).
           super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->denominator_units_).
      super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
      ._M_impl.super__Vector_impl_data._M_finish != pGVar2) {
    (this->denominator_units_).
    super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
    ._M_impl.super__Vector_impl_data._M_finish = pGVar2;
  }
  pGVar3 = (this->groups_).
           super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->groups_).
      super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup>_>
      ._M_impl.super__Vector_impl_data._M_finish != pGVar3) {
    (this->groups_).
    super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup>_>
    ._M_impl.super__Vector_impl_data._M_finish = pGVar3;
  }
  local_40 = &this->numerator_units_;
  local_48 = &this->denominator_units_;
  (this->unknown_fields_)._M_string_length = 0;
  local_50 = &this->groups_;
  local_38 = &this->unknown_fields_;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  puVar10 = (ulong *)(size + (long)raw);
  do {
    if (puVar10 <= raw) goto switchD_002295fd_caseD_3;
    bVar1 = (byte)*raw;
    uVar9 = (ulong)bVar1;
    puVar13 = (ulong *)((long)raw + 1);
    if ((char)bVar1 < '\0') {
      uVar9 = (ulong)(bVar1 & 0x7f);
      lVar7 = 7;
      do {
        if ((puVar10 <= puVar13) || (0x38 < lVar7 - 7U)) goto switchD_002295fd_caseD_3;
        uVar6 = *puVar13;
        puVar13 = (ulong *)((long)puVar13 + 1);
        uVar9 = uVar9 | (ulong)((byte)uVar6 & 0x7f) << ((byte)lVar7 & 0x3f);
        lVar7 = lVar7 + 7;
      } while ((char)(byte)uVar6 < '\0');
    }
    uVar6 = uVar9 >> 3;
    if (((uint)uVar6 == 0) || (puVar10 <= puVar13)) goto switchD_002295fd_caseD_3;
    switch((uint)uVar9 & 7) {
    case 0:
      uVar8 = 0;
      uVar12 = 0;
      while( true ) {
        puVar15 = (ulong *)((long)puVar13 + 1);
        uVar8 = (ulong)((byte)*puVar13 & 0x7f) << ((byte)uVar12 & 0x3f) | uVar8;
        if (-1 < (char)(byte)*puVar13) break;
        if ((puVar10 <= puVar15) ||
           (bVar5 = 0x38 < uVar12, uVar12 = uVar12 + 7, puVar13 = puVar15, bVar5))
        goto switchD_002295fd_caseD_3;
      }
      uVar12 = uVar8 & 0xffffffff00000000;
      break;
    case 1:
      puVar15 = puVar13 + 1;
      if (puVar10 < puVar15) goto switchD_002295fd_caseD_3;
      uVar8 = *puVar13;
      uVar12 = uVar8 & 0xffffffff00000000;
      break;
    case 2:
      puVar13 = (ulong *)((long)puVar13 + 1);
      uVar14 = 0;
      uVar8 = 0;
      puVar15 = puVar13;
      while (uVar14 = (ulong)(*(byte *)((long)puVar15 + -1) & 0x7f) << ((byte)uVar8 & 0x3f) | uVar14
            , (char)*(byte *)((long)puVar15 + -1) < '\0') {
        if (puVar10 <= puVar15) goto switchD_002295fd_caseD_3;
        puVar15 = (ulong *)((long)puVar15 + 1);
        puVar13 = (ulong *)((long)puVar13 + 1);
        bVar5 = 0x38 < uVar8;
        uVar8 = uVar8 + 7;
        if (bVar5) goto switchD_002295fd_caseD_3;
      }
      if (uVar14 <= (ulong)((long)puVar10 - (long)puVar13)) {
        uVar12 = (ulong)puVar13 & 0xffffffff00000000;
        puVar15 = (ulong *)((long)puVar15 + uVar14);
        uVar8 = (ulong)puVar13 & 0xffffffff;
        goto LAB_002296d9;
      }
    default:
      goto switchD_002295fd_caseD_3;
    case 5:
      puVar15 = (ulong *)((long)puVar13 + 4);
      if (puVar10 < puVar15) goto switchD_002295fd_caseD_3;
      uVar8 = (ulong)(uint)*puVar13;
      uVar12 = 0;
    }
    uVar14 = 0;
LAB_002296d9:
    raw = puVar15;
  } while ((0xffff < (uint)uVar6) || (0xfffffff < uVar14));
  local_70.int_value_ = uVar12 | uVar8 & 0xffffffff;
  uVar8 = uVar6 << 0x20 | uVar14;
  local_70.type_ = (byte)(uVar8 >> 0x30) | (byte)uVar9 & 7;
  local_70.size_ = (uint32_t)uVar14;
  local_70.id_ = (uint16_t)(uVar8 >> 0x20);
  if ((short)uVar6 != 0) {
    local_58 = &this->description_;
    local_60 = &this->name_;
    do {
      if ((ushort)uVar6 < 0xb) {
        (this->_has_field_).super__Base_bitset<1UL>._M_w =
             (this->_has_field_).super__Base_bitset<1UL>._M_w | 1L << ((byte)uVar6 & 0x3f);
      }
      raw = puVar15;
      switch((uint)uVar6 & 0xffff) {
      case 1:
        this->counter_id_ = (uint32_t)local_70.int_value_;
        break;
      case 2:
        protozero::Field::get(&local_70,local_60);
        break;
      case 3:
        protozero::Field::get(&local_70,local_58);
        break;
      default:
        protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>(&local_70,local_38);
        break;
      case 5:
        this->int_peak_value_ = local_70.int_value_;
        break;
      case 6:
        this->double_peak_value_ = (double)local_70.int_value_;
        break;
      case 7:
        iVar4._M_current =
             (this->numerator_units_).
             super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (this->numerator_units_).
            super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
          ::_M_realloc_insert<>(local_40,iVar4);
          pGVar11 = (this->numerator_units_).
                    super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          *iVar4._M_current = GpuCounterDescriptor_MeasureUnit_NONE;
          pGVar11 = iVar4._M_current + 1;
          (this->numerator_units_).
          super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
          ._M_impl.super__Vector_impl_data._M_finish = pGVar11;
        }
        goto LAB_002298f0;
      case 8:
        iVar4._M_current =
             (this->denominator_units_).
             super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (this->denominator_units_).
            super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
          ::_M_realloc_insert<>(local_48,iVar4);
          pGVar11 = (this->denominator_units_).
                    super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          *iVar4._M_current = GpuCounterDescriptor_MeasureUnit_NONE;
          pGVar11 = iVar4._M_current + 1;
          (this->denominator_units_).
          super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
          ._M_impl.super__Vector_impl_data._M_finish = pGVar11;
        }
        goto LAB_002298f0;
      case 9:
        this->select_by_default_ = (double)local_70.int_value_ != 0.0;
        break;
      case 10:
        __position._M_current =
             (this->groups_).
             super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->groups_).
            super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup>_>
          ::_M_realloc_insert<>(local_50,__position);
          pGVar11 = (this->groups_).
                    super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          *__position._M_current = GpuCounterDescriptor_GpuCounterGroup_UNCLASSIFIED;
          pGVar11 = __position._M_current + 1;
          (this->groups_).
          super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup>_>
          ._M_impl.super__Vector_impl_data._M_finish = pGVar11;
        }
LAB_002298f0:
        pGVar11[-1] = (GpuCounterDescriptor_GpuCounterGroup)local_70.int_value_;
      }
      do {
        if (puVar10 <= raw) goto switchD_002295fd_caseD_3;
        bVar1 = (byte)*raw;
        uVar9 = (ulong)(uint)bVar1;
        puVar13 = (ulong *)((long)raw + 1);
        if ((char)bVar1 < '\0') {
          uVar9 = (ulong)(bVar1 & 0x7f);
          lVar7 = 7;
          do {
            if ((puVar10 <= puVar13) || (0x38 < lVar7 - 7U)) goto switchD_002295fd_caseD_3;
            uVar6 = *puVar13;
            puVar13 = (ulong *)((long)puVar13 + 1);
            uVar9 = uVar9 | (ulong)((byte)uVar6 & 0x7f) << ((byte)lVar7 & 0x3f);
            lVar7 = lVar7 + 7;
          } while ((char)(byte)uVar6 < '\0');
        }
        uVar6 = uVar9 >> 3;
        if (((uint)uVar6 == 0) || (puVar10 <= puVar13)) goto switchD_002295fd_caseD_3;
        switch((uint)uVar9 & 7) {
        case 0:
          uVar8 = 0;
          uVar12 = 0;
          while( true ) {
            puVar15 = (ulong *)((long)puVar13 + 1);
            uVar8 = (ulong)((byte)*puVar13 & 0x7f) << ((byte)uVar12 & 0x3f) | uVar8;
            if (-1 < (char)(byte)*puVar13) break;
            if ((puVar10 <= puVar15) ||
               (bVar5 = 0x38 < uVar12, uVar12 = uVar12 + 7, puVar13 = puVar15, bVar5))
            goto switchD_002295fd_caseD_3;
          }
          uVar12 = uVar8 & 0xffffffff00000000;
          break;
        case 1:
          puVar15 = puVar13 + 1;
          if (puVar10 < puVar15) goto switchD_002295fd_caseD_3;
          uVar8 = *puVar13;
          uVar12 = uVar8 & 0xffffffff00000000;
          break;
        case 2:
          puVar13 = (ulong *)((long)puVar13 + 1);
          uVar14 = 0;
          uVar8 = 0;
          puVar15 = puVar13;
          while (uVar14 = (ulong)(*(byte *)((long)puVar15 + -1) & 0x7f) << ((byte)uVar8 & 0x3f) |
                          uVar14, (char)*(byte *)((long)puVar15 + -1) < '\0') {
            if (puVar10 <= puVar15) goto switchD_002295fd_caseD_3;
            puVar15 = (ulong *)((long)puVar15 + 1);
            puVar13 = (ulong *)((long)puVar13 + 1);
            bVar5 = 0x38 < uVar8;
            uVar8 = uVar8 + 7;
            if (bVar5) goto switchD_002295fd_caseD_3;
          }
          if (uVar14 <= (ulong)((long)puVar10 - (long)puVar13)) {
            uVar12 = (ulong)puVar13 & 0xffffffff00000000;
            puVar15 = (ulong *)((long)puVar15 + uVar14);
            uVar8 = (ulong)puVar13 & 0xffffffff;
            goto LAB_00229a7e;
          }
        default:
          goto switchD_002295fd_caseD_3;
        case 5:
          puVar15 = (ulong *)((long)puVar13 + 4);
          if (puVar10 < puVar15) goto switchD_002295fd_caseD_3;
          uVar8 = (ulong)(uint)*puVar13;
          uVar12 = 0;
        }
        uVar14 = 0;
LAB_00229a7e:
        raw = puVar15;
      } while ((0xffff < (uint)uVar6) || (0xfffffff < uVar14));
      local_70.int_value_ = uVar12 | uVar8 & 0xffffffff;
      uVar8 = uVar6 << 0x20 | uVar14;
      local_70.type_ = (byte)(uVar8 >> 0x30) | (byte)uVar9 & 7;
      local_70.size_ = (uint32_t)uVar14;
      local_70.id_ = (uint16_t)(uVar8 >> 0x20);
    } while ((short)uVar6 != 0);
  }
switchD_002295fd_caseD_3:
  return puVar10 == (ulong *)raw;
}

Assistant:

bool GpuCounterDescriptor_GpuCounterSpec::ParseFromArray(const void* raw, size_t size) {
  numerator_units_.clear();
  denominator_units_.clear();
  groups_.clear();
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 1 /* counter_id */:
        field.get(&counter_id_);
        break;
      case 2 /* name */:
        field.get(&name_);
        break;
      case 3 /* description */:
        field.get(&description_);
        break;
      case 5 /* int_peak_value */:
        field.get(&int_peak_value_);
        break;
      case 6 /* double_peak_value */:
        field.get(&double_peak_value_);
        break;
      case 7 /* numerator_units */:
        numerator_units_.emplace_back();
        field.get(&numerator_units_.back());
        break;
      case 8 /* denominator_units */:
        denominator_units_.emplace_back();
        field.get(&denominator_units_.back());
        break;
      case 9 /* select_by_default */:
        field.get(&select_by_default_);
        break;
      case 10 /* groups */:
        groups_.emplace_back();
        field.get(&groups_.back());
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}